

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,string *output)

{
  int iVar1;
  int byte_size_before_serialization;
  int byte_size_after_serialization;
  char *pcVar2;
  undefined4 extraout_var;
  uint8 *end;
  uint8 *start;
  int byte_size;
  int old_size;
  string *output_local;
  MessageLite *this_local;
  
  iVar1 = std::__cxx11::string::size();
  byte_size_before_serialization = (*this->_vptr_MessageLite[9])();
  STLStringResizeUninitialized(output,(long)(iVar1 + byte_size_before_serialization));
  pcVar2 = string_as_array(output);
  pcVar2 = pcVar2 + iVar1;
  iVar1 = (*this->_vptr_MessageLite[0xb])(this,pcVar2);
  if (CONCAT44(extraout_var,iVar1) - (long)pcVar2 != (long)byte_size_before_serialization) {
    byte_size_after_serialization = (*this->_vptr_MessageLite[9])();
    anon_unknown_9::ByteSizeConsistencyError
              (byte_size_before_serialization,byte_size_after_serialization,iVar1 - (int)pcVar2);
  }
  return true;
}

Assistant:

bool MessageLite::AppendPartialToString(string* output) const {
  int old_size = output->size();
  int byte_size = ByteSize();
  STLStringResizeUninitialized(output, old_size + byte_size);
  uint8* start = reinterpret_cast<uint8*>(string_as_array(output) + old_size);
  uint8* end = SerializeWithCachedSizesToArray(start);
  if (end - start != byte_size) {
    ByteSizeConsistencyError(byte_size, ByteSize(), end - start);
  }
  return true;
}